

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int AddFrame(WebPDemuxer *dmux,Frame *frame)

{
  Frame *last_frame;
  Frame *frame_local;
  WebPDemuxer *dmux_local;
  int local_4;
  
  if ((*dmux->frames_tail == (Frame *)0x0) || ((*dmux->frames_tail)->complete != 0)) {
    *dmux->frames_tail = frame;
    frame->next = (Frame *)0x0;
    dmux->frames_tail = &frame->next;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int AddFrame(WebPDemuxer* const dmux, Frame* const frame) {
  const Frame* const last_frame = *dmux->frames_tail;
  if (last_frame != NULL && !last_frame->complete) return 0;

  *dmux->frames_tail = frame;
  frame->next = NULL;
  dmux->frames_tail = &frame->next;
  return 1;
}